

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O2

void __thiscall FactorisedJoin::~FactorisedJoin(FactorisedJoin *this)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar1;
  pointer ppVar2;
  long lVar3;
  
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__FactorisedJoin_00152ce8;
  pvVar1 = this->_ids;
  if (pvVar1 != (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0) {
    ppVar2 = pvVar1[-1].
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (ppVar2 != (pointer)0x0) {
      lVar3 = (long)ppVar2 * 0x18;
      do {
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   ((long)&pvVar1[-1].
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != 0);
    }
    operator_delete__(&pvVar1[-1].
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Hashtable<std::vector<double,_std::allocator<double>_>,_std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->_caches)._M_h);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_dataHandler).super___shared_ptr<DataHandler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

FactorisedJoin::~FactorisedJoin()
{
    delete[] _ids;
}